

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O0

int __thiscall
VC1StreamReader::writeAdditionData
          (VC1StreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,AVPacket *avPacket,
          PriorityDataInfo *priorityData)

{
  bool bVar1;
  size_type sVar2;
  VodCoreException *pVVar3;
  uchar *puVar4;
  string local_380;
  ostringstream local_360 [8];
  ostringstream ss_1;
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream ss;
  uint8_t *local_38;
  uint8_t *curPtr;
  PriorityDataInfo *priorityData_local;
  AVPacket *avPacket_local;
  uint8_t *dstEnd_local;
  uint8_t *dstBuffer_local;
  VC1StreamReader *this_local;
  
  local_38 = dstBuffer;
  if ((((1 < (this->super_MPEGStreamReader).m_totalFrameNum) && (this->m_spsFound < 2)) &&
      ((this->m_frame).pict_type == I_TYPE)) ||
     (((1 < (this->super_MPEGStreamReader).m_totalFrameNum && ((this->m_firstFileFrame & 1U) != 0))
      && ((this->m_decodedAfterSeq & 1U) == 0)))) {
    this->m_firstFileFrame = false;
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->m_seqBuffer);
    if (!bVar1) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_seqBuffer);
      if ((ulong)((long)dstEnd - (long)dstBuffer) < sVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1b0);
        std::operator<<((ostream *)local_1b0,"VC1 stream error: Not enough buffer for write headers"
                       );
        pVVar3 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(pVVar3,3,&local_1e0);
        __cxa_throw(pVVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->m_seqBuffer);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_seqBuffer);
      memcpy(dstBuffer,puVar4,sVar2);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_seqBuffer);
      local_38 = dstBuffer + sVar2;
    }
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (&this->m_entryPointBuffer);
    if (!bVar1) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_entryPointBuffer);
      if ((ulong)((long)dstEnd - (long)local_38) < sVar2) {
        std::__cxx11::ostringstream::ostringstream(local_360);
        std::operator<<((ostream *)local_360,"VC1 stream error: Not enough buffer for write headers"
                       );
        pVVar3 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(pVVar3,3,&local_380);
        __cxa_throw(pVVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         (&this->m_entryPointBuffer);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_entryPointBuffer);
      memcpy(local_38,puVar4,sVar2);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_entryPointBuffer);
      local_38 = local_38 + sVar2;
    }
  }
  return (int)local_38 - (int)dstBuffer;
}

Assistant:

int VC1StreamReader::writeAdditionData(uint8_t* dstBuffer, uint8_t* dstEnd, AVPacket& avPacket,
                                       PriorityDataInfo* priorityData)
{
    // uint8_t* afterPesData = (uint8_t*)pesPacket + pesPacket->getHeaderLength();
    uint8_t* curPtr = dstBuffer;  // afterPesData;
    if ((m_totalFrameNum > 1 && m_spsFound < 2 && m_frame.pict_type == VC1PictType::I_TYPE) ||
        (m_totalFrameNum > 1 && m_firstFileFrame && !m_decodedAfterSeq))
    {
        m_firstFileFrame = false;
        if (!m_seqBuffer.empty())
        {
            if (static_cast<size_t>(dstEnd - curPtr) < m_seqBuffer.size())
                THROW(ERR_COMMON, "VC1 stream error: Not enough buffer for write headers")
            memcpy(curPtr, m_seqBuffer.data(), m_seqBuffer.size());
            curPtr += m_seqBuffer.size();
        }
        if (!m_entryPointBuffer.empty())
        {
            if (static_cast<size_t>(dstEnd - curPtr) < m_entryPointBuffer.size())
                THROW(ERR_COMMON, "VC1 stream error: Not enough buffer for write headers")
            memcpy(curPtr, m_entryPointBuffer.data(), m_entryPointBuffer.size());
            curPtr += m_entryPointBuffer.size();
        }
    }
    return static_cast<int>(curPtr - dstBuffer);  // afterPesData;
}